

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_file_bag.c
# Opt level: O2

ion_err_t lfb_get(ion_lfb_t *bag,ion_file_offset_t offset,uint num_bytes,ion_byte_t *write_to,
                 ion_file_offset_t *next)

{
  ion_err_t iVar1;
  
  iVar1 = ion_fread_at(bag->file_handle,offset,8,(ion_byte_t *)next);
  if (iVar1 != '\0') {
    return iVar1;
  }
  iVar1 = ion_fread_at(bag->file_handle,offset + 8,num_bytes,write_to);
  return iVar1;
}

Assistant:

ion_err_t
lfb_get(
	ion_lfb_t			*bag,
	ion_file_offset_t	offset,
	unsigned int		num_bytes,
	ion_byte_t			*write_to,
	ion_file_offset_t	*next
) {
	ion_err_t error;

	error = ion_fread_at(bag->file_handle, offset, sizeof(ion_file_offset_t), (ion_byte_t *) next);

	if (err_ok != error) {
		return error;
	}

	error = ion_fread_at(bag->file_handle, offset + sizeof(ion_file_offset_t), num_bytes, write_to);

	return error;
}